

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitArrayInitData(PrintExpressionContents *this,ArrayInitData *curr)

{
  HeapType type;
  string_view str;
  
  str._M_str = "array.init_data ";
  str._M_len = 0x10;
  printMedium(this->o,str);
  type = wasm::Type::getHeapType(&curr->ref->type);
  printHeapTypeName(this,type);
  std::operator<<(this->o,' ');
  Name::print(&curr->segment,this->o);
  return;
}

Assistant:

void visitArrayInitData(ArrayInitData* curr) {
    printMedium(o, "array.init_data ");
    printHeapTypeName(curr->ref->type.getHeapType());
    o << ' ';
    curr->segment.print(o);
  }